

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_mixer.cpp
# Opt level: O0

int __thiscall MixerContext::init(MixerContext *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  double dVar4;
  uint32_t j_1;
  int ch_in;
  uint32_t i_1;
  int value;
  double target;
  uint32_t j;
  int sum;
  double rem;
  uint32_t i;
  int maxsum;
  int r;
  MixerContext *in_stack_00000a28;
  uint local_48;
  int local_44;
  uint local_40;
  uint local_30;
  int local_2c;
  double local_28;
  uint local_1c;
  int local_18;
  undefined4 local_14;
  MixerContext *local_10;
  int local_4;
  
  local_10 = this;
  local_4 = auto_matrix(in_stack_00000a28);
  if (local_4 == 0) {
    local_14 = 0;
    if (this->_format == CUBEB_SAMPLE_S16LE) {
      local_18 = 0;
      for (local_1c = 0; local_1c < this->_out_ch_count; local_1c = local_1c + 1) {
        local_28 = 0.0;
        local_2c = 0;
        for (local_30 = 0; local_30 < this->_in_ch_count; local_30 = local_30 + 1) {
          dVar4 = this->_matrix[local_1c][local_30] * 32768.0 + local_28;
          lVar2 = lrintf((float)dVar4);
          iVar1 = (int)lVar2;
          local_28 = (dVar4 - (double)iVar1) + local_28;
          if (iVar1 < 1) {
            iVar1 = -iVar1;
          }
          local_2c = iVar1 + local_2c;
        }
        piVar3 = std::max<int>(&local_18,&local_2c);
        local_18 = *piVar3;
      }
      if (0x8000 < local_18) {
        this->_clipping = true;
      }
    }
    for (local_40 = 0; local_40 < 0x20; local_40 = local_40 + 1) {
      local_44 = 0;
      for (local_48 = 0; local_48 < 0x20; local_48 = local_48 + 1) {
        lVar2 = lrintf((float)(this->_matrix[local_40][local_48] * 32768.0));
        this->_matrix32[local_40][local_48] = (int32_t)lVar2;
        dVar4 = this->_matrix[local_40][local_48];
        if ((dVar4 != 0.0) || (NAN(dVar4))) {
          local_44 = local_44 + 1;
          this->_matrix_ch[local_40][local_44] = (uint8_t)local_48;
        }
      }
      this->_matrix_ch[local_40][0] = (uint8_t)local_44;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
MixerContext::init()
{
  int r = auto_matrix();
  if (r) {
    return r;
  }

  // Determine if matrix operation would overflow
  if (_format == CUBEB_SAMPLE_S16NE) {
    int maxsum = 0;
    for (uint32_t i = 0; i < _out_ch_count; i++) {
      double rem = 0;
      int sum = 0;

      for (uint32_t j = 0; j < _in_ch_count; j++) {
        double target = _matrix[i][j] * 32768 + rem;
        int value = lrintf(target);
        rem += target - value;
        sum += std::abs(value);
      }
      maxsum = std::max(maxsum, sum);
    }
    if (maxsum > 32768) {
      _clipping = true;
    }
  }

  // FIXME quantize for integers
  for (uint32_t i = 0; i < CHANNELS_MAX; i++) {
    int ch_in = 0;
    for (uint32_t j = 0; j < CHANNELS_MAX; j++) {
      _matrix32[i][j] = lrintf(_matrix[i][j] * 32768);
      if (_matrix[i][j]) {
        _matrix_ch[i][++ch_in] = j;
      }
    }
    _matrix_ch[i][0] = ch_in;
  }

  return 0;
}